

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O3

void Diligent::AppendShaderSourceCode(string *Source,ShaderCreateInfo *ShaderCI)

{
  char (*in_RCX) [29];
  ShaderSourceFileData SourceData;
  string local_38;
  
  if (ShaderCI->ByteCode != (void *)0x0) {
    FormatString<char[26],char[29]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderCI.ByteCode == nullptr",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"AppendShaderSourceCode",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
               ,0x116);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  ReadShaderSourceFile
            ((ShaderSourceFileData *)&local_38,ShaderCI->Source,(ShaderCI->field_4).SourceLength,
             ShaderCI->pShaderSourceStreamFactory,ShaderCI->FilePath);
  std::__cxx11::string::append((char *)Source,local_38._M_string_length);
  if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_38._M_dataplus._M_p + 0x10))();
  }
  return;
}

Assistant:

void AppendShaderSourceCode(std::string& Source, const ShaderCreateInfo& ShaderCI) noexcept(false)
{
    VERIFY_EXPR(ShaderCI.ByteCode == nullptr);
    const auto SourceData = ReadShaderSourceFile(ShaderCI);
    Source.append(SourceData.Source, SourceData.SourceLength);
}